

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  (this->
  super_ParamIteratorInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00f70760;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->current_value_).
              super___shared_ptr<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_testing::internal::ParamIterator<int>_>
  ::~_Tuple_impl(&(this->current_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_testing::internal::ParamIterator<int>_>
                );
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_testing::internal::ParamIterator<int>_>
  ::~_Tuple_impl(&(this->end_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_testing::internal::ParamIterator<int>_>
                );
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_testing::internal::ParamIterator<int>_>
  ::~_Tuple_impl(&(this->begin_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_testing::internal::ParamIterator<int>_>
                );
  return;
}

Assistant:

~IteratorImpl() override {}